

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::fixBlockUniformLayoutMatrix
          (TParseContext *this,TQualifier *qualifier,TTypeList *originTypeList,
          TTypeList *tmpTypeList)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TTypeList *pTVar7;
  TTypeList *tmpTypeList_00;
  int __flags;
  void *__child_stack;
  __fn *__fn;
  void *in_R8;
  bool bVar8;
  TType *local_78;
  TTypeList *structure;
  TType *tmpType;
  TQualifier *memberQualifier;
  uint member;
  TTypeList *tmpTypeList_local;
  TTypeList *originTypeList_local;
  TQualifier *qualifier_local;
  TParseContext *this_local;
  
  bVar8 = true;
  if (tmpTypeList != (TTypeList *)0x0) {
    sVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                      (&originTypeList->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      );
    sVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                      (&tmpTypeList->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      );
    bVar8 = sVar4 == sVar5;
  }
  if (!bVar8) {
    __assert_fail("tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                  ,0x2685,
                  "void glslang::TParseContext::fixBlockUniformLayoutMatrix(TQualifier &, TTypeList *, TTypeList *)"
                 );
  }
  memberQualifier._4_4_ = 0;
  do {
    sVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                      (&originTypeList->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      );
    if (sVar4 <= memberQualifier._4_4_) {
      return;
    }
    if ((qualifier->field_0x10 & 0xf) != 0) {
      if (tmpTypeList == (TTypeList *)0x0) {
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&originTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberQualifier._4_4_);
        uVar2 = (*pvVar6->type->_vptr_TType[0x1c])();
        if ((uVar2 & 1) == 0) {
          pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                   operator[](&originTypeList->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ,(ulong)memberQualifier._4_4_);
          iVar3 = (*pvVar6->type->_vptr_TType[7])();
          if (iVar3 != 0xf) goto LAB_006a9045;
        }
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&originTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberQualifier._4_4_);
        iVar3 = (*pvVar6->type->_vptr_TType[10])();
        if ((uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var,iVar3) + 8) >> 0x3d) == 0) {
          uVar1 = *(ulong *)&qualifier->field_0x8;
          pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                   operator[](&originTypeList->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ,(ulong)memberQualifier._4_4_);
          iVar3 = (*pvVar6->type->_vptr_TType[10])();
          sVar4 = *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 8) & 0x1fffffffffffffff |
                  uVar1 & 0xe000000000000000;
          *(size_type *)(CONCAT44(extraout_var_00,iVar3) + 8) = sVar4;
        }
      }
      else {
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&tmpTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberQualifier._4_4_);
        uVar2 = (*pvVar6->type->_vptr_TType[0x1c])();
        if ((uVar2 & 1) == 0) {
          pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                   operator[](&tmpTypeList->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ,(ulong)memberQualifier._4_4_);
          iVar3 = (*pvVar6->type->_vptr_TType[7])();
          if (iVar3 != 0xf) goto LAB_006a9045;
        }
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&tmpTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberQualifier._4_4_);
        iVar3 = (*pvVar6->type->_vptr_TType[10])();
        if ((uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_01,iVar3) + 8) >> 0x3d) == 0) {
          uVar1 = *(ulong *)&qualifier->field_0x8;
          pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                   operator[](&tmpTypeList->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ,(ulong)memberQualifier._4_4_);
          iVar3 = (*pvVar6->type->_vptr_TType[10])();
          sVar4 = *(ulong *)(CONCAT44(extraout_var_02,iVar3) + 8) & 0x1fffffffffffffff |
                  uVar1 & 0xe000000000000000;
          *(size_type *)(CONCAT44(extraout_var_02,iVar3) + 8) = sVar4;
        }
      }
    }
LAB_006a9045:
    __flags = (int)sVar4;
    pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (&originTypeList->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ,(ulong)memberQualifier._4_4_);
    iVar3 = (*pvVar6->type->_vptr_TType[7])();
    if (iVar3 == 0xf) {
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](&originTypeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ,(ulong)memberQualifier._4_4_);
      iVar3 = (*pvVar6->type->_vptr_TType[10])();
      tmpType = (TType *)qualifier;
      if ((uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_03,iVar3) + 8) >> 0x3d) != 0) {
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&originTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberQualifier._4_4_);
        iVar3 = (*pvVar6->type->_vptr_TType[10])();
        tmpType = (TType *)CONCAT44(extraout_var_04,iVar3);
      }
      if (tmpTypeList == (TTypeList *)0x0) {
        __fn = (__fn *)(ulong)memberQualifier._4_4_;
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&originTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(size_type)__fn);
        iVar3 = TType::clone(pvVar6->type,__fn,__child_stack,__flags,in_R8);
        local_78 = (TType *)CONCAT44(extraout_var_05,iVar3);
      }
      else {
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&tmpTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberQualifier._4_4_);
        local_78 = pvVar6->type;
      }
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](&originTypeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ,(ulong)memberQualifier._4_4_);
      pTVar7 = TType::getWritableStruct(pvVar6->type);
      tmpTypeList_00 = TType::getWritableStruct(local_78);
      fixBlockUniformLayoutMatrix(this,(TQualifier *)tmpType,pTVar7,tmpTypeList_00);
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](&originTypeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ,(ulong)memberQualifier._4_4_);
      pTVar7 = recordStructCopy(this,&this->matrixFixRecord,pvVar6->type,local_78);
      if (tmpTypeList == (TTypeList *)0x0) {
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&originTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberQualifier._4_4_);
        TType::setStruct(pvVar6->type,pTVar7);
      }
      else {
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&tmpTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberQualifier._4_4_);
        TType::setStruct(pvVar6->type,pTVar7);
      }
    }
    memberQualifier._4_4_ = memberQualifier._4_4_ + 1;
  } while( true );
}

Assistant:

void TParseContext::fixBlockUniformLayoutMatrix(TQualifier& qualifier, TTypeList* originTypeList,
                                                TTypeList* tmpTypeList)
{
    assert(tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size());
    for (unsigned int member = 0; member < originTypeList->size(); ++member) {
        if (qualifier.layoutPacking != ElpNone) {
            if (tmpTypeList == nullptr) {
                if (((*originTypeList)[member].type->isMatrix() ||
                     (*originTypeList)[member].type->getBasicType() == EbtStruct) &&
                    (*originTypeList)[member].type->getQualifier().layoutMatrix == ElmNone) {
                    (*originTypeList)[member].type->getQualifier().layoutMatrix = qualifier.layoutMatrix;
                }
            } else {
                if (((*tmpTypeList)[member].type->isMatrix() ||
                     (*tmpTypeList)[member].type->getBasicType() == EbtStruct) &&
                    (*tmpTypeList)[member].type->getQualifier().layoutMatrix == ElmNone) {
                    (*tmpTypeList)[member].type->getQualifier().layoutMatrix = qualifier.layoutMatrix;
                }
            }
        }

        if ((*originTypeList)[member].type->getBasicType() == EbtStruct) {
            TQualifier* memberQualifier = nullptr;
            // block member can be declare a matrix style, so it should be update to the member's style
            if ((*originTypeList)[member].type->getQualifier().layoutMatrix == ElmNone) {
                memberQualifier = &qualifier;
            } else {
                memberQualifier = &((*originTypeList)[member].type->getQualifier());
            }

            const TType* tmpType = tmpTypeList == nullptr ?
                (*originTypeList)[member].type->clone() : (*tmpTypeList)[member].type;

            fixBlockUniformLayoutMatrix(*memberQualifier, (*originTypeList)[member].type->getWritableStruct(),
                                        tmpType->getWritableStruct());

            const TTypeList* structure = recordStructCopy(matrixFixRecord, (*originTypeList)[member].type, tmpType);

            if (tmpTypeList == nullptr) {
                (*originTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
            if (tmpTypeList != nullptr) {
                (*tmpTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
        }
    }
}